

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O1

void pfederc::fatal(char *file,int line,string *msg)

{
  size_t sVar1;
  ostream *poVar2;
  char local_19;
  
  if (file == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x12d228);
  }
  else {
    sVar1 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,file,sVar1);
  }
  local_19 = ':';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_19,1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(msg->_M_dataplus)._M_p,msg->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  exit(1);
}

Assistant:

void pfederc::fatal(const char *file,
    int line, const std::string &msg) noexcept {
  std::cerr << file << ':' << line << ": " << msg << std::endl;
  std::exit(1);
}